

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ED.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppVVar1;
  pointer *ppmVar2;
  pointer *this;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  EdgeDrawing *pEVar10;
  ulong uVar11;
  size_type sVar12;
  reference pvVar13;
  float *pfVar14;
  reference pvVar15;
  reference pvVar16;
  Point PVar17;
  reference pvVar18;
  double *pdVar19;
  int in_R8D;
  Scalar_ *pSVar20;
  vector<int,_std::allocator<int>_> local_2b58;
  _InputArray local_2b38;
  allocator local_2b19;
  string local_2b18 [32];
  vector<int,_std::allocator<int>_> local_2af8;
  _InputArray local_2ae0;
  allocator local_2ac1;
  string local_2ac0 [32];
  Size_<int> local_2aa0;
  Point_<int> local_2a98;
  _InputOutputArray local_2a90;
  undefined1 local_2a78 [8];
  Scalar color_5;
  double angle_5;
  Size axes_5;
  Point center_5;
  size_t i_8;
  Point_<int> local_2a30;
  _InputOutputArray local_2a28;
  undefined1 local_2a10 [8];
  Scalar color_4;
  double angle_4;
  Size axes_4;
  Point center_4;
  int i_7;
  Point_<int> local_29c8;
  _InputOutputArray local_29c0;
  undefined1 local_29a8 [8];
  Scalar color_3;
  double angle_3;
  Size axes_3;
  Point center_3;
  int i_6;
  Mat local_2908 [96];
  vector<mEllipse,_std::allocator<mEllipse>_> local_28a8;
  vector<mCircle,_std::allocator<mCircle>_> local_2890;
  _OutputArray local_2878;
  EDColor local_2860;
  undefined1 local_2708 [8];
  EDCircles colorCircle;
  _OutputArray local_2408;
  _InputArray local_23f0;
  _InputArray local_23d8;
  Scalar_<double> local_23c0;
  Point_<double> local_23a0;
  Point_ local_2390 [8];
  Point_<double> local_2388;
  Point_ local_2378 [8];
  _InputOutputArray local_2370;
  int local_2354;
  undefined1 local_2350 [4];
  int i_5;
  Mat local_2330 [96];
  _OutputArray local_22d0;
  vector<int,_std::allocator<int>_> local_22b8;
  _InputArray local_22a0;
  allocator local_2281;
  string local_2280 [32];
  undefined1 local_2260 [440];
  undefined1 local_20a8 [8];
  EDLines colorLine;
  _InputArray local_1df0;
  allocator local_1dd1;
  string local_1dd0 [32];
  _InputArray local_1db0;
  _OutputArray local_1d98;
  _InputArray local_1d80;
  _InputArray local_1d68;
  _OutputArray local_1d50;
  _InputArray local_1d38;
  undefined1 local_1d20 [192];
  undefined1 local_1c60 [8];
  EDColor testEDColor;
  _InputArray local_1af0;
  allocator local_1ad1;
  string local_1ad0 [32];
  _InputArray local_1ab0;
  _OutputArray local_1a98;
  _InputArray local_1a80;
  _InputArray local_1a68;
  _OutputArray local_1a50;
  undefined1 local_1a38 [120];
  Mat local_19c0 [96];
  undefined1 local_1960 [8];
  EDPF testEDPF;
  _InputArray local_16f8;
  allocator local_16d9;
  string local_16d8 [32];
  vector<int,_std::allocator<int>_> local_16b8;
  _InputArray local_1698;
  allocator local_1679;
  string local_1678 [32];
  Size_<int> local_1658;
  Point_<int> local_1650;
  _InputOutputArray local_1648;
  undefined1 local_1630 [8];
  Scalar color_2;
  double angle_2;
  Size axes_2;
  Point center_2;
  size_t i_4;
  Point_<int> local_15e8;
  _InputOutputArray local_15e0;
  undefined1 local_15c8 [8];
  Scalar color_1;
  double angle_1;
  Size axes_1;
  Point center_1;
  int i_3;
  Point_<int> local_1580;
  _InputOutputArray local_1578;
  undefined1 local_1560 [8];
  Scalar color;
  double angle;
  Size axes;
  Point center;
  int i_2;
  _InputArray local_1508;
  _InputArray local_14f0;
  _InputArray local_14d8;
  undefined1 local_14c0 [8];
  vector<mEllipse,_std::allocator<mEllipse>_> found_ellipses;
  vector<mCircle,_std::allocator<mCircle>_> found_circles;
  ED local_1478;
  undefined1 local_1250 [8];
  EDCircles testEDCircles;
  _InputArray local_f48;
  allocator local_f29;
  string local_f28 [32];
  _InputArray local_f08;
  _OutputArray local_ef0;
  _InputArray local_ed8;
  _InputArray local_ec0;
  Scalar_<double> local_ea8;
  Point_<double> local_e88;
  Point_ local_e78 [8];
  Point_<double> local_e70;
  Point_ local_e60 [8];
  _InputOutputArray local_e58;
  int local_e3c;
  undefined1 local_e38 [4];
  int i_1;
  Mat local_e18 [8];
  Mat lineImg1;
  _OutputArray local_db8;
  undefined1 local_da0 [8];
  Mat lineImg0;
  int local_d94;
  ED local_d40;
  undefined1 local_b18 [8];
  EDLines testEDLines;
  _InputArray local_860;
  allocator local_841;
  string local_840 [32];
  _InputArray local_820;
  _OutputArray local_808;
  _InputArray local_7f0;
  _InputArray local_7d8;
  _OutputArray local_7c0;
  undefined1 local_7a8 [8];
  Mat edgeImg0;
  Mat local_748 [8];
  Mat diff;
  Mat local_6e8 [8];
  Mat edgeImg1;
  vector<int,_std::allocator<int>_> local_688;
  _InputArray local_668;
  allocator local_649;
  string local_648 [32];
  vector<int,_std::allocator<int>_> local_628;
  _InputArray local_608;
  allocator local_5e9;
  string local_5e8 [32];
  undefined1 local_5c8 [8];
  Mat gradImg;
  undefined1 local_568 [8];
  Mat anchImg;
  _InputArray local_508;
  Mat local_4f0 [96];
  undefined1 local_490 [8];
  ED testED;
  undefined1 local_260 [4];
  int i;
  TickMeter tm;
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  _InputArray local_208;
  _InputArray local_1f0;
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [8];
  Mat colorImg;
  Mat local_140 [8];
  Mat ellipsImg1;
  Mat local_e0 [8];
  Mat ellipsImg0;
  Mat local_80 [8];
  Mat testImg;
  char *local_20;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_20 = "billiard.jpg";
  }
  else {
    local_20 = argv[1];
  }
  cv::Mat::Mat(local_80);
  cv::Mat::Mat(local_e0);
  cv::Mat::Mat(local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,local_20,&local_1c1);
  cv::imread(local_1a0,(int)local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  cv::_InputArray::_InputArray(&local_1f0,(Mat *)local_1a0);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_208,local_80);
  cv::cvtColor((cv *)&local_1f0,&local_208,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_208);
  cv::_InputArray::~_InputArray(&local_1f0);
  cv::ximgproc::createEdgeDrawing();
  std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::vector
            ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
             &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::vector
            ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)&tm.startTime);
  cv::TickMeter::TickMeter((TickMeter *)local_260);
  for (testED._548_4_ = 0; (int)testED._548_4_ < 3; testED._548_4_ = testED._548_4_ + 1) {
    std::operator<<((ostream *)&std::cout,"\n#################################################");
    poVar9 = std::operator<<((ostream *)&std::cout,"\n####### ( ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,testED._548_4_);
    std::operator<<(poVar9," ) ORIGINAL & OPENCV COMPARISON ######");
    std::operator<<((ostream *)&std::cout,"\n#################################################\n");
    ppVVar1 = &ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0xc) = 1;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x10) = 0x24;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x14) = 8;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x20) = 0x3f800000;
    cv::TickMeter::start((TickMeter *)local_260);
    cv::Mat::Mat(local_4f0,local_80);
    ED::ED((ED *)local_490,local_4f0,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
    cv::Mat::~Mat(local_4f0);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"testED.getEdgeImage()  (Original)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray(&local_508,local_80);
    (**(code **)(*(long *)pEVar10 + 0x40))(pEVar10,&local_508);
    cv::_InputArray::~_InputArray(&local_508);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    ED::getAnchorImage((ED *)local_568);
    ED::getGradImage((ED *)local_5c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e8,"GradImage.png",&local_5e9);
    cv::_InputArray::_InputArray(&local_608,(Mat *)local_5c8);
    local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_628);
    cv::imwrite(local_5e8,&local_608,(vector *)&local_628);
    std::vector<int,_std::allocator<int>_>::~vector(&local_628);
    cv::_InputArray::~_InputArray(&local_608);
    std::__cxx11::string::~string(local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"AnchorImage.png",&local_649);
    cv::_InputArray::_InputArray(&local_668,(Mat *)local_568);
    local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_688);
    cv::imwrite(local_648,&local_668,(vector *)&local_688);
    std::vector<int,_std::allocator<int>_>::~vector(&local_688);
    cv::_InputArray::~_InputArray(&local_668);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    cv::Mat::Mat(local_6e8);
    cv::Mat::Mat(local_748);
    ED::getEdgeImage((ED *)local_7a8);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray(&local_7c0,local_6e8);
    (**(code **)(*(long *)pEVar10 + 0x48))(pEVar10,&local_7c0);
    cv::_OutputArray::~_OutputArray(&local_7c0);
    cv::_InputArray::_InputArray(&local_7d8,(Mat *)local_7a8);
    cv::_InputArray::_InputArray(&local_7f0,local_6e8);
    cv::_OutputArray::_OutputArray(&local_808,local_748);
    cv::absdiff(&local_7d8,&local_7f0,&local_808);
    cv::_OutputArray::~_OutputArray(&local_808);
    cv::_InputArray::~_InputArray(&local_7f0);
    cv::_InputArray::~_InputArray(&local_7d8);
    poVar9 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    cv::_InputArray::_InputArray(&local_820,local_748);
    iVar7 = cv::countNonZero(&local_820);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::~_InputArray(&local_820);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_840,"EdgeImage.png",&local_841);
    cv::_InputArray::_InputArray(&local_860,local_6e8);
    testEDLines.nfa = (NFALUT *)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&testEDLines.nfa);
    cv::imwrite(local_840,&local_860,(vector *)&testEDLines.nfa);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&testEDLines.nfa);
    cv::_InputArray::~_InputArray(&local_860);
    std::__cxx11::string::~string(local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    ED::ED(&local_d40,(ED *)local_490);
    EDLines::EDLines((EDLines *)local_b18,&local_d40,1.0,-1,6.0,1.3);
    ED::~ED(&local_d40);
    cv::TickMeter::stop((TickMeter *)local_260);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    poVar9 = std::operator<<((ostream *)&std::cout,"testEDLines.getLineImage()         : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    EDLines::getLineImage((EDLines *)local_da0);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray<cv::Vec<float,4>>
              (&local_db8,
               (vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)&tm.startTime);
    (**(code **)(*(long *)pEVar10 + 0x60))(pEVar10,&local_db8);
    cv::_OutputArray::~_OutputArray(&local_db8);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectLines()            (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    iVar7 = _lineImg0;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_e38,255.0);
    pSVar20 = (Scalar_ *)local_e38;
    cv::Mat::Mat(local_e18,iVar7,local_d94,0,pSVar20);
    local_e3c = 0;
    while( true ) {
      iVar7 = (int)pSVar20;
      uVar11 = (ulong)local_e3c;
      sVar12 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::size
                         ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                          &tm.startTime);
      if (sVar12 <= uVar11) break;
      cv::_InputOutputArray::_InputOutputArray(&local_e58,local_e18);
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_e3c);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,0);
      fVar3 = *pfVar14;
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_e3c);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,1);
      cv::Point_<double>::Point_(&local_e70,(double)fVar3,(double)*pfVar14);
      cv::Point_::operator_cast_to_Point_(local_e60);
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_e3c);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,2);
      fVar3 = *pfVar14;
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_e3c);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,3);
      cv::Point_<double>::Point_(&local_e88,(double)fVar3,(double)*pfVar14);
      cv::Point_::operator_cast_to_Point_(local_e78);
      cv::Scalar_<double>::Scalar_(&local_ea8,0.0);
      pSVar20 = (Scalar_ *)0x1;
      cv::line(&local_e58,local_e60,local_e78,&local_ea8,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_e58);
      local_e3c = local_e3c + 1;
    }
    cv::_InputArray::_InputArray(&local_ec0,(Mat *)local_da0);
    cv::_InputArray::_InputArray(&local_ed8,local_e18);
    cv::_OutputArray::_OutputArray(&local_ef0,local_748);
    cv::absdiff(&local_ec0,&local_ed8,&local_ef0);
    cv::_OutputArray::~_OutputArray(&local_ef0);
    cv::_InputArray::~_InputArray(&local_ed8);
    cv::_InputArray::~_InputArray(&local_ec0);
    poVar9 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    cv::_InputArray::_InputArray(&local_f08,local_748);
    iVar8 = cv::countNonZero(&local_f08);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::~_InputArray(&local_f08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f28,"LinesImage.png",&local_f29);
    cv::_InputArray::_InputArray(&local_f48,local_e18);
    testEDCircles.nfa = (NFALUT *)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&testEDCircles.nfa);
    cv::imwrite(local_f28,&local_f48,(vector *)&testEDCircles.nfa);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&testEDCircles.nfa);
    cv::_InputArray::~_InputArray(&local_f48);
    std::__cxx11::string::~string(local_f28);
    std::allocator<char>::~allocator((allocator<char> *)&local_f29);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    ED::ED(&local_1478,(ED *)local_b18);
    EDCircles::EDCircles((EDCircles *)local_1250,&local_1478);
    ED::~ED(&local_1478);
    cv::TickMeter::stop((TickMeter *)local_260);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    poVar9 = std::operator<<((ostream *)&std::cout,"EDCircles(testEDLines)             : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray<cv::Vec<double,6>>
              ((_OutputArray *)
               &found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
               &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    (**(code **)(*(long *)pEVar10 + 0x68))
              (pEVar10,&found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::~_OutputArray
              ((_OutputArray *)
               &found_circles.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    EDCircles::getCircles
              ((vector<mCircle,_std::allocator<mCircle>_> *)
               &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(EDCircles *)local_1250);
    EDCircles::getEllipses
              ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,(EDCircles *)local_1250);
    cv::_InputArray::_InputArray(&local_14d8,local_80);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_14f0,local_e0);
    cv::cvtColor((cv *)&local_14d8,&local_14f0,(_OutputArray *)0x8,0,iVar7);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_14f0);
    cv::_InputArray::~_InputArray(&local_14d8);
    cv::_InputArray::_InputArray(&local_1508,local_80);
    cv::_OutputArray::_OutputArray((_OutputArray *)&center.y,local_140);
    cv::cvtColor((cv *)&local_1508,(_InputArray *)&center.y,(_OutputArray *)0x8,0,iVar7);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&center.y);
    cv::_InputArray::~_InputArray(&local_1508);
    center.x = 0;
    while( true ) {
      uVar11 = (ulong)center.x;
      sVar12 = std::vector<mCircle,_std::allocator<mCircle>_>::size
                         ((vector<mCircle,_std::allocator<mCircle>_> *)
                          &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar12 <= uVar11) break;
      ppmVar2 = &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center.x);
      dVar6 = (pvVar15->center).x;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center.x);
      cv::Point_<int>::Point_((Point_<int> *)&axes,(int)dVar6,(int)(pvVar15->center).y);
      ppmVar2 = &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center.x);
      dVar6 = pvVar15->r;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center.x);
      cv::Size_<int>::Size_((Size_<int> *)((long)&angle + 4),(int)dVar6,(int)pvVar15->r);
      color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_1560,0.0,255.0,0.0,0.0);
      cv::_InputOutputArray::_InputOutputArray(&local_1578,local_e0);
      cv::Point_<int>::Point_(&local_1580,(Point_<int> *)&axes);
      cv::Size_<int>::Size_((Size_<int> *)&center_1.y,(Size_<int> *)((long)&angle + 4));
      cv::ellipse(SUB84(color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_1578,&local_1580,&center_1.y,local_1560,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_1578);
      center.x = center.x + 1;
    }
    center_1.x = 0;
    while( true ) {
      uVar11 = (ulong)center_1.x;
      sVar12 = std::vector<mEllipse,_std::allocator<mEllipse>_>::size
                         ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0);
      if (sVar12 <= uVar11) break;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_1.x);
      dVar6 = (pvVar16->center).x;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_1.x);
      cv::Point_<int>::Point_((Point_<int> *)&axes_1,(int)dVar6,(int)(pvVar16->center).y);
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_1.x);
      iVar7 = (pvVar16->axes).width;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_1.x);
      cv::Size_<int>::Size_((Size_<int> *)((long)&angle_1 + 4),iVar7,(pvVar16->axes).height);
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_1.x);
      color_1.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pvVar16->theta * 180.0) / 3.141592653589793;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_15c8,255.0,255.0,0.0,0.0);
      cv::_InputOutputArray::_InputOutputArray(&local_15e0,local_e0);
      cv::Point_<int>::Point_(&local_15e8,(Point_<int> *)&axes_1);
      cv::Size_<int>::Size_((Size_<int> *)&i_4,(Size_<int> *)((long)&angle_1 + 4));
      cv::ellipse(SUB84(color_1.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_15e0,&local_15e8,&i_4,local_15c8,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_15e0);
      center_1.x = center_1.x + 1;
    }
    center_2.x = 0;
    center_2.y = 0;
    while( true ) {
      PVar17 = (Point)std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::size
                                ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *
                                 )&lines.
                                   super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((ulong)PVar17 <= (ulong)center_2) break;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,0);
      dVar6 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,1);
      cv::Point_<int>::Point_((Point_<int> *)&axes_2,(int)dVar6,(int)*pdVar19);
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      dVar6 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,3);
      dVar4 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      dVar5 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,4);
      cv::Size_<int>::Size_
                ((Size_<int> *)&angle_2,(int)dVar6 + (int)dVar4,(int)dVar5 + (int)*pdVar19);
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,5);
      color_2.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_2);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      if ((*pdVar19 != 0.0) || (NAN(*pdVar19))) {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_1630,0.0,255.0,0.0,0.0);
      }
      else {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_1630,255.0,255.0,0.0,0.0);
      }
      cv::_InputOutputArray::_InputOutputArray(&local_1648,local_140);
      cv::Point_<int>::Point_(&local_1650,(Point_<int> *)&axes_2);
      cv::Size_<int>::Size_(&local_1658,(Size_<int> *)&angle_2);
      cv::ellipse(SUB84(color_2.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_1648,&local_1650,&local_1658,local_1630,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_1648);
      center_2 = (Point)((long)center_2 + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1678,"EllipsImage-Original.png",&local_1679);
    cv::_InputArray::_InputArray(&local_1698,local_e0);
    local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_16b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_16b8);
    cv::imwrite(local_1678,&local_1698,(vector *)&local_16b8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_16b8);
    cv::_InputArray::~_InputArray(&local_1698);
    std::__cxx11::string::~string(local_1678);
    std::allocator<char>::~allocator((allocator<char> *)&local_1679);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16d8,"EllipsImage-OpenCV.png",&local_16d9);
    cv::_InputArray::_InputArray(&local_16f8,local_140);
    testEDPF.gradImg = (short *)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&testEDPF.gradImg);
    cv::imwrite(local_16d8,&local_16f8,(vector *)&testEDPF.gradImg);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&testEDPF.gradImg);
    cv::_InputArray::~_InputArray(&local_16f8);
    std::__cxx11::string::~string(local_16d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_16d9);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    cv::Mat::Mat(local_19c0,local_80);
    EDPF::EDPF((EDPF *)local_1960,local_19c0);
    cv::Mat::~Mat(local_19c0);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"testEDPF.getEdgeImage()            : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    ppVVar1 = &ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0xc) = 0;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x10) = 0xb;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x14) = 3;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    pEVar10[8] = (EdgeDrawing)0x1;
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray((_InputArray *)(local_1a38 + 0x60),local_80);
    (**(code **)(*(long *)pEVar10 + 0x40))(pEVar10,local_1a38 + 0x60);
    cv::_InputArray::~_InputArray((_InputArray *)(local_1a38 + 0x60));
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectEdges()  PF        (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    ED::getEdgeImage((ED *)local_1a38);
    cv::Mat::operator=((Mat *)local_7a8,(Mat *)local_1a38);
    cv::Mat::~Mat((Mat *)local_1a38);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray(&local_1a50,local_6e8);
    (**(code **)(*(long *)pEVar10 + 0x48))(pEVar10,&local_1a50);
    cv::_OutputArray::~_OutputArray(&local_1a50);
    cv::_InputArray::_InputArray(&local_1a68,(Mat *)local_7a8);
    cv::_InputArray::_InputArray(&local_1a80,local_6e8);
    cv::_OutputArray::_OutputArray(&local_1a98,local_748);
    cv::absdiff(&local_1a68,&local_1a80,&local_1a98);
    cv::_OutputArray::~_OutputArray(&local_1a98);
    cv::_InputArray::~_InputArray(&local_1a80);
    cv::_InputArray::~_InputArray(&local_1a68);
    poVar9 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    cv::_InputArray::_InputArray(&local_1ab0,local_748);
    iVar7 = cv::countNonZero(&local_1ab0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::~_InputArray(&local_1ab0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ad0,"EdgeImage-PF.png",&local_1ad1);
    cv::_InputArray::_InputArray(&local_1af0,local_6e8);
    testEDColor.segments.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = &testEDColor.segments.
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
    cv::imwrite(local_1ad0,&local_1af0,(vector *)this);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &testEDColor.segments.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::~_InputArray(&local_1af0);
    std::__cxx11::string::~string(local_1ad0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ad1);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    cv::Mat::Mat((Mat *)(local_1d20 + 0x60),(Mat *)local_1a0);
    EDColor::EDColor((EDColor *)local_1c60,(Mat *)(local_1d20 + 0x60),0x24,4,1.5,false);
    cv::Mat::~Mat((Mat *)(local_1d20 + 0x60));
    EDColor::getEdgeImage((EDColor *)local_1d20);
    cv::Mat::operator=((Mat *)local_7a8,(Mat *)local_1d20);
    cv::Mat::~Mat((Mat *)local_1d20);
    cv::TickMeter::stop((TickMeter *)local_260);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    poVar9 = std::operator<<((ostream *)&std::cout,"testEDColor.getEdgeImage()         : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    ppVVar1 = &ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0xc) = 0;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x10) = 0x24;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x14) = 4;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    *(undefined4 *)(pEVar10 + 0x20) = 0x3fc00000;
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)ppVVar1);
    pEVar10[8] = (EdgeDrawing)0x0;
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray(&local_1d38,(Mat *)local_1a0);
    (**(code **)(*(long *)pEVar10 + 0x40))(pEVar10,&local_1d38);
    cv::_InputArray::~_InputArray(&local_1d38);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray(&local_1d50,local_6e8);
    (**(code **)(*(long *)pEVar10 + 0x48))(pEVar10,&local_1d50);
    cv::_OutputArray::~_OutputArray(&local_1d50);
    cv::_InputArray::_InputArray(&local_1d68,(Mat *)local_7a8);
    cv::_InputArray::_InputArray(&local_1d80,local_6e8);
    cv::_OutputArray::_OutputArray(&local_1d98,local_748);
    cv::absdiff(&local_1d68,&local_1d80,&local_1d98);
    cv::_OutputArray::~_OutputArray(&local_1d98);
    cv::_InputArray::~_InputArray(&local_1d80);
    cv::_InputArray::~_InputArray(&local_1d68);
    poVar9 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    cv::_InputArray::_InputArray(&local_1db0,local_748);
    iVar7 = cv::countNonZero(&local_1db0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::~_InputArray(&local_1db0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1dd0,"EdgeImage-Color.png",&local_1dd1);
    cv::_InputArray::_InputArray(&local_1df0,(Mat *)local_7a8);
    colorLine.nfa = (NFALUT *)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&colorLine.nfa);
    cv::imwrite(local_1dd0,&local_1df0,(vector *)&colorLine.nfa);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&colorLine.nfa);
    cv::_InputArray::~_InputArray(&local_1df0);
    std::__cxx11::string::~string(local_1dd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1dd1);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    EDColor::EDColor((EDColor *)(local_2260 + 0x60),(EDColor *)local_1c60);
    EDLines::EDLines((EDLines *)local_20a8,(EDColor *)(local_2260 + 0x60),1.0,-1,6.0,1.3);
    EDColor::~EDColor((EDColor *)(local_2260 + 0x60));
    cv::TickMeter::stop((TickMeter *)local_260);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    poVar9 = std::operator<<((ostream *)&std::cout,"get lines from color image         : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    EDLines::getLineImage((EDLines *)local_2260);
    cv::Mat::operator=((Mat *)local_da0,(Mat *)local_2260);
    cv::Mat::~Mat((Mat *)local_2260);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2280,"LinesImage-Color.png",&local_2281);
    cv::_InputArray::_InputArray(&local_22a0,(Mat *)local_da0);
    local_22b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_22b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_22b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_22b8);
    cv::imwrite(local_2280,&local_22a0,(vector *)&local_22b8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_22b8);
    cv::_InputArray::~_InputArray(&local_22a0);
    std::__cxx11::string::~string(local_2280);
    std::allocator<char>::~allocator((allocator<char> *)&local_2281);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray<cv::Vec<float,4>>
              (&local_22d0,
               (vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)&tm.startTime);
    (**(code **)(*(long *)pEVar10 + 0x60))(pEVar10,&local_22d0);
    cv::_OutputArray::~_OutputArray(&local_22d0);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectLines()            (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    iVar7 = _lineImg0;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_2350,255.0);
    cv::Mat::Mat(local_2330,iVar7,local_d94,0,(Scalar_ *)local_2350);
    cv::Mat::operator=(local_e18,local_2330);
    cv::Mat::~Mat(local_2330);
    local_2354 = 0;
    while( true ) {
      uVar11 = (ulong)local_2354;
      sVar12 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::size
                         ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                          &tm.startTime);
      if (sVar12 <= uVar11) break;
      cv::_InputOutputArray::_InputOutputArray(&local_2370,local_e18);
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_2354);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,0);
      fVar3 = *pfVar14;
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_2354);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,1);
      cv::Point_<double>::Point_(&local_2388,(double)fVar3,(double)*pfVar14);
      cv::Point_::operator_cast_to_Point_(local_2378);
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_2354);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,2);
      fVar3 = *pfVar14;
      pvVar13 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                          ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                           &tm.startTime,(long)local_2354);
      pfVar14 = cv::Vec<float,_4>::operator[](pvVar13,3);
      cv::Point_<double>::Point_(&local_23a0,(double)fVar3,(double)*pfVar14);
      cv::Point_::operator_cast_to_Point_(local_2390);
      cv::Scalar_<double>::Scalar_(&local_23c0,0.0);
      cv::line(&local_2370,local_2378,local_2390,&local_23c0,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_2370);
      local_2354 = local_2354 + 1;
    }
    cv::_InputArray::_InputArray(&local_23d8,(Mat *)local_da0);
    cv::_InputArray::_InputArray(&local_23f0,local_e18);
    cv::_OutputArray::_OutputArray(&local_2408,local_748);
    cv::absdiff(&local_23d8,&local_23f0,&local_2408);
    cv::_OutputArray::~_OutputArray(&local_2408);
    cv::_InputArray::~_InputArray(&local_23f0);
    cv::_InputArray::~_InputArray(&local_23d8);
    poVar9 = std::operator<<((ostream *)&std::cout,"different pixel count              : ");
    cv::_InputArray::_InputArray((_InputArray *)&colorCircle.nfa,local_748);
    iVar7 = cv::countNonZero((_InputArray *)&colorCircle.nfa);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::_InputArray::~_InputArray((_InputArray *)&colorCircle.nfa);
    std::operator<<((ostream *)&std::cout,"-------------------------------------------------\n");
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    EDColor::EDColor(&local_2860,(EDColor *)local_1c60);
    EDCircles::EDCircles((EDCircles *)local_2708,&local_2860);
    EDColor::~EDColor(&local_2860);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"get circles from color image       : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    cv::TickMeter::reset((TickMeter *)local_260);
    cv::TickMeter::start((TickMeter *)local_260);
    pEVar10 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                        ((Ptr<cv::ximgproc::EdgeDrawing> *)
                         &ellipses.
                          super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray<cv::Vec<double,6>>
              (&local_2878,
               (vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
               &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    (**(code **)(*(long *)pEVar10 + 0x68))(pEVar10,&local_2878);
    cv::_OutputArray::~_OutputArray(&local_2878);
    cv::TickMeter::stop((TickMeter *)local_260);
    poVar9 = std::operator<<((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ");
    dVar6 = cv::TickMeter::getTimeMilli((TickMeter *)local_260);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar6);
    poVar9 = std::operator<<(poVar9," ms.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    EDCircles::getCircles(&local_2890,(EDCircles *)local_2708);
    std::vector<mCircle,_std::allocator<mCircle>_>::operator=
              ((vector<mCircle,_std::allocator<mCircle>_> *)
               &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_2890);
    std::vector<mCircle,_std::allocator<mCircle>_>::~vector(&local_2890);
    EDCircles::getEllipses(&local_28a8,(EDCircles *)local_2708);
    std::vector<mEllipse,_std::allocator<mEllipse>_>::operator=
              ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,&local_28a8);
    std::vector<mEllipse,_std::allocator<mEllipse>_>::~vector(&local_28a8);
    cv::Mat::clone();
    cv::Mat::operator=(local_e0,local_2908);
    cv::Mat::~Mat(local_2908);
    cv::Mat::clone();
    cv::Mat::operator=(local_140,(Mat *)&center_3.y);
    cv::Mat::~Mat((Mat *)&center_3.y);
    center_3.x = 0;
    while( true ) {
      uVar11 = (ulong)center_3.x;
      sVar12 = std::vector<mCircle,_std::allocator<mCircle>_>::size
                         ((vector<mCircle,_std::allocator<mCircle>_> *)
                          &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar12 <= uVar11) break;
      ppmVar2 = &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center_3.x);
      dVar6 = (pvVar15->center).x;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center_3.x);
      cv::Point_<int>::Point_((Point_<int> *)&axes_3,(int)dVar6,(int)(pvVar15->center).y);
      ppmVar2 = &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center_3.x);
      dVar6 = pvVar15->r;
      pvVar15 = std::vector<mCircle,_std::allocator<mCircle>_>::operator[]
                          ((vector<mCircle,_std::allocator<mCircle>_> *)ppmVar2,(long)center_3.x);
      cv::Size_<int>::Size_((Size_<int> *)((long)&angle_3 + 4),(int)dVar6,(int)pvVar15->r);
      color_3.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_29a8,0.0,255.0,0.0,0.0);
      cv::_InputOutputArray::_InputOutputArray(&local_29c0,local_e0);
      cv::Point_<int>::Point_(&local_29c8,(Point_<int> *)&axes_3);
      cv::Size_<int>::Size_((Size_<int> *)&center_4.y,(Size_<int> *)((long)&angle_3 + 4));
      cv::ellipse(SUB84(color_3.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_29c0,&local_29c8,&center_4.y,local_29a8,2,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_29c0);
      center_3.x = center_3.x + 1;
    }
    center_4.x = 0;
    while( true ) {
      uVar11 = (ulong)center_4.x;
      sVar12 = std::vector<mEllipse,_std::allocator<mEllipse>_>::size
                         ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0);
      if (sVar12 <= uVar11) break;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_4.x);
      dVar6 = (pvVar16->center).x;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_4.x);
      cv::Point_<int>::Point_((Point_<int> *)&axes_4,(int)dVar6,(int)(pvVar16->center).y);
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_4.x);
      iVar7 = (pvVar16->axes).width;
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_4.x);
      cv::Size_<int>::Size_((Size_<int> *)((long)&angle_4 + 4),iVar7,(pvVar16->axes).height);
      pvVar16 = std::vector<mEllipse,_std::allocator<mEllipse>_>::operator[]
                          ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0,
                           (long)center_4.x);
      color_4.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pvVar16->theta * 180.0) / 3.141592653589793;
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_2a10,255.0,255.0,0.0,0.0);
      cv::_InputOutputArray::_InputOutputArray(&local_2a28,local_e0);
      cv::Point_<int>::Point_(&local_2a30,(Point_<int> *)&axes_4);
      cv::Size_<int>::Size_((Size_<int> *)&i_8,(Size_<int> *)((long)&angle_4 + 4));
      cv::ellipse(SUB84(color_4.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_2a28,&local_2a30,&i_8,local_2a10,2,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_2a28);
      center_4.x = center_4.x + 1;
    }
    center_5.x = 0;
    center_5.y = 0;
    while( true ) {
      PVar17 = (Point)std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::size
                                ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *
                                 )&lines.
                                   super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((ulong)PVar17 <= (ulong)center_5) break;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,0);
      dVar6 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,1);
      cv::Point_<int>::Point_((Point_<int> *)&axes_5,(int)dVar6,(int)*pdVar19);
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      dVar6 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,3);
      dVar4 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      dVar5 = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,4);
      cv::Size_<int>::Size_
                ((Size_<int> *)&angle_5,(int)dVar6 + (int)dVar4,(int)dVar5 + (int)*pdVar19);
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,5);
      color_5.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = *pdVar19;
      pvVar18 = std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::operator[]
                          ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                           &lines.
                            super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)center_5);
      pdVar19 = cv::Vec<double,_6>::operator[](pvVar18,2);
      if ((*pdVar19 != 0.0) || (NAN(*pdVar19))) {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_2a78,0.0,255.0,0.0,0.0);
      }
      else {
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_2a78,255.0,255.0,0.0,0.0);
      }
      cv::_InputOutputArray::_InputOutputArray(&local_2a90,local_140);
      cv::Point_<int>::Point_(&local_2a98,(Point_<int> *)&axes_5);
      cv::Size_<int>::Size_(&local_2aa0,(Size_<int> *)&angle_5);
      cv::ellipse(SUB84(color_5.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3],0),0,
                  0x4076800000000000,&local_2a90,&local_2a98,&local_2aa0,local_2a78,2,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_2a90);
      center_5 = (Point)((long)center_5 + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ac0,"EllipsImageColor-Original.png",&local_2ac1);
    cv::_InputArray::_InputArray(&local_2ae0,local_e0);
    local_2af8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2af8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2af8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_2af8);
    cv::imwrite(local_2ac0,&local_2ae0,(vector *)&local_2af8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_2af8);
    cv::_InputArray::~_InputArray(&local_2ae0);
    std::__cxx11::string::~string(local_2ac0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ac1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b18,"EllipsImageColor-OpenCV.png",&local_2b19);
    cv::_InputArray::_InputArray(&local_2b38,local_140);
    local_2b58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2b58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2b58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_2b58);
    cv::imwrite(local_2b18,&local_2b38,(vector *)&local_2b58);
    std::vector<int,_std::allocator<int>_>::~vector(&local_2b58);
    cv::_InputArray::~_InputArray(&local_2b38);
    std::__cxx11::string::~string(local_2b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b19);
    EDCircles::~EDCircles((EDCircles *)local_2708);
    EDLines::~EDLines((EDLines *)local_20a8);
    EDColor::~EDColor((EDColor *)local_1c60);
    EDPF::~EDPF((EDPF *)local_1960);
    std::vector<mEllipse,_std::allocator<mEllipse>_>::~vector
              ((vector<mEllipse,_std::allocator<mEllipse>_> *)local_14c0);
    std::vector<mCircle,_std::allocator<mCircle>_>::~vector
              ((vector<mCircle,_std::allocator<mCircle>_> *)
               &found_ellipses.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    EDCircles::~EDCircles((EDCircles *)local_1250);
    cv::Mat::~Mat(local_e18);
    cv::Mat::~Mat((Mat *)local_da0);
    EDLines::~EDLines((EDLines *)local_b18);
    cv::Mat::~Mat((Mat *)local_7a8);
    cv::Mat::~Mat(local_748);
    cv::Mat::~Mat(local_6e8);
    cv::Mat::~Mat((Mat *)local_5c8);
    cv::Mat::~Mat((Mat *)local_568);
    ED::~ED((ED *)local_490);
  }
  std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::~vector
            ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)&tm.startTime);
  std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::~vector
            ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
             &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Ptr<cv::ximgproc::EdgeDrawing>::~Ptr
            ((Ptr<cv::ximgproc::EdgeDrawing> *)
             &ellipses.super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)local_1a0);
  cv::Mat::~Mat(local_140);
  cv::Mat::~Mat(local_e0);
  cv::Mat::~Mat(local_80);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    char* filename;
    if (argc > 1)
        filename = argv[1];
    else
        filename = "billiard.jpg";

    Mat testImg, ellipsImg0, ellipsImg1;
    Mat colorImg = imread(filename);
    cvtColor(colorImg, testImg, COLOR_BGR2GRAY);

    Ptr<EdgeDrawing> ed = createEdgeDrawing();
    vector<Vec6d> ellipses;
    vector<Vec4f> lines;

    TickMeter tm;
    for (int i = 0; i < 3; i++)
    {
        cout << "\n#################################################";
        cout << "\n####### ( " << i << " ) ORIGINAL & OPENCV COMPARISON ######";
        cout << "\n#################################################\n";

        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.Sigma = 1.0;

        //Detection of edge segments from an input image    
        tm.start();
        //Call ED constructor
        ED testED = ED(testImg, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
        tm.stop();
        std::cout << "testED.getEdgeImage()  (Original)  : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat anchImg = testED.getAnchorImage();
        Mat gradImg = testED.getGradImage();
        imwrite("GradImage.png", gradImg);
        imwrite("AnchorImage.png", anchImg);

        Mat edgeImg1, diff;
        Mat edgeImg0 = testED.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;

        imwrite("EdgeImage.png", edgeImg1);

        //***************************** EDLINES Line Segment Detection *****************************
        //Detection of lines segments from edge segments instead of input image
        //Therefore, redundant detection of edge segmens can be avoided
        tm.reset();
        tm.start();
        EDLines testEDLines = EDLines(testED);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDLines.getLineImage()         : " << tm.getTimeMilli() << " ms." << endl;
        Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image

        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("LinesImage.png", lineImg1);

        //***************************** EDCIRCLES Circle Segment Detection *****************************
        //Detection of circles from already available EDPF or ED image
        tm.reset();
        tm.start();
        EDCircles testEDCircles = EDCircles(testEDLines);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "EDCircles(testEDLines)             : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;
        cout << "-------------------------------------------------\n";

        vector<mCircle> found_circles = testEDCircles.getCircles();
        vector<mEllipse> found_ellipses = testEDCircles.getEllipses();

        cvtColor(testImg, ellipsImg0, COLOR_GRAY2BGR);
        cvtColor(testImg, ellipsImg1, COLOR_GRAY2BGR);
 
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        imwrite("EllipsImage-Original.png", ellipsImg0);
        imwrite("EllipsImage-OpenCV.png", ellipsImg1);

        //************************** EDPF Parameter-free Edge Segment Detection **************************
        // Detection of edge segments with parameter free ED (EDPF)
        tm.reset();
        tm.start();
        EDPF testEDPF = EDPF(testImg);
        tm.stop();
        cout << "testEDPF.getEdgeImage()            : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 11;
        ed->params.AnchorThresholdValue = 3;
        ed->params.PFmode = true;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()  PF        (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        edgeImg0 = testEDPF.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-PF.png", edgeImg1);

        //*********************** EDCOLOR Edge Segment Detection from Color Images **********************

        tm.reset();
        tm.start();
        EDColor testEDColor = EDColor(colorImg, 36);
        edgeImg0 = testEDColor.getEdgeImage();
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDColor.getEdgeImage()         : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 4;
        ed->params.Sigma = 1.5;
        ed->params.PFmode = false;
        tm.reset();
        tm.start();
        ed->detectEdges(colorImg);
        tm.stop();
        cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-Color.png", edgeImg0);

        tm.reset();
        tm.start();
        // get lines from color image
        EDLines colorLine = EDLines(testEDColor);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "get lines from color image         : " << tm.getTimeMilli() << " ms." << endl;
        lineImg0 = colorLine.getLineImage();
        imwrite("LinesImage-Color.png", lineImg0);
        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        cout << "-------------------------------------------------\n";
        tm.reset();
        tm.start();
        // get circles from color image
        EDCircles colorCircle = EDCircles(testEDColor);
        tm.stop();
        cout << "get circles from color image       : " << tm.getTimeMilli() << " ms." << endl;
        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        found_circles = colorCircle.getCircles();
        found_ellipses = colorCircle.getEllipses();

        ellipsImg0 = colorImg.clone();
        ellipsImg1 = colorImg.clone();
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        imwrite("EllipsImageColor-Original.png", ellipsImg0);
        imwrite("EllipsImageColor-OpenCV.png", ellipsImg1);
    }
    return 0;
}